

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testNNValidatorReshape3D(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureType *pFVar3;
  ostream *poVar4;
  Result local_b0;
  ReshapeLayerParams *reshapeParams;
  NeuralNetworkLayer *reshapeLayer;
  NeuralNetwork *nn;
  ArrayFeatureType *outshape;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *local_48;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(local_48,"input");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  out = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,1);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  outshape = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)outshape,"output");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)outshape);
  nn = (NeuralNetwork *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)nn,1);
  reshapeLayer = (NeuralNetworkLayer *)
                 CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  reshapeParams =
       (ReshapeLayerParams *)
       CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)reshapeLayer);
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)reshapeParams,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)reshapeParams,"output");
  local_b0.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_reshape
                 ((NeuralNetworkLayer *)reshapeParams);
  CoreML::Specification::ReshapeLayerParams::add_targetshape
            ((ReshapeLayerParams *)local_b0.m_message._M_storage._M_storage,1);
  CoreML::Specification::ReshapeLayerParams::add_targetshape
            ((ReshapeLayerParams *)local_b0.m_message._M_storage._M_storage,1);
  CoreML::Specification::ReshapeLayerParams::add_targetshape
            ((ReshapeLayerParams *)local_b0.m_message._M_storage._M_storage,1);
  CoreML::Specification::ReshapeLayerParams::set_mode
            ((ReshapeLayerParams *)local_b0.m_message._M_storage._M_storage,
             ReshapeLayerParams_ReshapeOrder_CHANNEL_FIRST);
  CoreML::validate<(MLModelType)500>(&local_b0,(Model *)&topIn);
  bVar1 = CoreML::Result::good(&local_b0);
  if (!bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x364);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"(res).good()");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  m1._oneof_case_[0]._0_1_ = !bVar1;
  CoreML::Result::~Result(&local_b0);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testNNValidatorReshape3D() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(1);

    auto *nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *reshapeLayer = nn->add_layers();
    reshapeLayer->add_input("input");
    reshapeLayer->add_output("output");
    Specification::ReshapeLayerParams *reshapeParams = reshapeLayer->mutable_reshape();

    reshapeParams->add_targetshape(1);
    reshapeParams->add_targetshape(1);
    reshapeParams->add_targetshape(1);

    reshapeParams->set_mode(::CoreML::Specification::ReshapeLayerParams_ReshapeOrder::ReshapeLayerParams_ReshapeOrder_CHANNEL_FIRST); Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    return 0;
}